

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O2

int QuantizeSingle(int16_t *v,VP8Matrix *mtx)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  int16_t iVar6;
  int iVar7;
  
  uVar1 = *v;
  uVar4 = -uVar1;
  if (0 < (short)uVar1) {
    uVar4 = uVar1;
  }
  uVar5 = (uint)uVar4;
  if ((int)mtx->zthresh[0] < (int)(uint)uVar4) {
    iVar7 = (uint)mtx->q[0] * ((uint)mtx->iq[0] * (uint)uVar4 + mtx->bias[0] >> 0x11);
    uVar5 = (uint)uVar4 - iVar7;
    iVar2 = -iVar7;
    if (-1 < (short)uVar1) {
      iVar2 = iVar7;
    }
    iVar6 = (int16_t)iVar2;
  }
  else {
    iVar6 = 0;
  }
  uVar3 = -uVar5;
  if (-1 < (short)uVar1) {
    uVar3 = uVar5;
  }
  *v = iVar6;
  return (int)uVar3 >> 1;
}

Assistant:

static int QuantizeSingle(int16_t* WEBP_RESTRICT const v,
                          const VP8Matrix* WEBP_RESTRICT const mtx) {
  int V = *v;
  const int sign = (V < 0);
  if (sign) V = -V;
  if (V > (int)mtx->zthresh[0]) {
    const int qV = QUANTDIV(V, mtx->iq[0], mtx->bias[0]) * mtx->q[0];
    const int err = (V - qV);
    *v = sign ? -qV : qV;
    return (sign ? -err : err) >> DSCALE;
  }
  *v = 0;
  return (sign ? -V : V) >> DSCALE;
}